

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

termline * decompressline(compressed_scrollback_line *line)

{
  undefined1 auVar1 [16];
  byte bVar2;
  byte bVar3;
  termline *ldata;
  termchar *ptVar4;
  long lVar5;
  byte bVar6;
  uint uVar7;
  wchar_t wVar8;
  int iVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  BinarySource bs [1];
  BinarySource local_58;
  long lVar12;
  
  local_58.binarysource_ = &local_58;
  local_58.len = line->len;
  local_58.data = line + 1;
  local_58.pos = 0;
  local_58.err = BSE_NO_ERROR;
  bVar6 = 0;
  wVar8 = L'\0';
  do {
    bVar2 = BinarySource_get_byte(local_58.binarysource_);
    bVar3 = bVar6 & 0x1f;
    wVar8 = wVar8 | (uint)(bVar2 & 0x7f) << bVar3;
    bVar6 = bVar6 + 7;
  } while ((char)bVar2 < '\0');
  bVar6 = 0;
  ldata = (termline *)safemalloc(1,0x28,(ulong)(uint)(0 << bVar3));
  ptVar4 = (termchar *)safemalloc((long)wVar8,0x20,0);
  ldata->chars = ptVar4;
  ldata->size = wVar8;
  ldata->cols = wVar8;
  ldata->temporary = true;
  ldata->cc_free = L'\0';
  auVar1 = _DAT_00122610;
  if (L'\0' < wVar8) {
    lVar5 = (ulong)(uint)wVar8 - 1;
    auVar9._8_4_ = (int)lVar5;
    auVar9._0_8_ = lVar5;
    auVar9._12_4_ = (int)((ulong)lVar5 >> 0x20);
    lVar5 = 0;
    auVar9 = auVar9 ^ _DAT_00122610;
    auVar11 = _DAT_00122630;
    auVar13 = _DAT_00122600;
    do {
      auVar14 = auVar13 ^ auVar1;
      iVar10 = auVar9._4_4_;
      if ((bool)(~(auVar14._4_4_ == iVar10 && auVar9._0_4_ < auVar14._0_4_ || iVar10 < auVar14._4_4_
                  ) & 1)) {
        *(undefined4 *)((long)&ptVar4->cc_next + lVar5) = 0;
      }
      if ((auVar14._12_4_ != auVar9._12_4_ || auVar14._8_4_ <= auVar9._8_4_) &&
          auVar14._12_4_ <= auVar9._12_4_) {
        *(undefined4 *)((long)&ptVar4[1].cc_next + lVar5) = 0;
      }
      auVar14 = auVar11 ^ auVar1;
      iVar15 = auVar14._4_4_;
      if (iVar15 <= iVar10 && (iVar15 != iVar10 || auVar14._0_4_ <= auVar9._0_4_)) {
        *(undefined4 *)((long)&ptVar4[2].cc_next + lVar5) = 0;
        *(undefined4 *)((long)&ptVar4[3].cc_next + lVar5) = 0;
      }
      lVar12 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 4;
      auVar13._8_8_ = lVar12 + 4;
      lVar12 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 4;
      auVar11._8_8_ = lVar12 + 4;
      lVar5 = lVar5 + 0x80;
    } while ((ulong)((uint)(wVar8 + L'\x03') >> 2) << 7 != lVar5);
  }
  uVar7 = 0;
  do {
    bVar3 = BinarySource_get_byte(local_58.binarysource_);
    uVar7 = uVar7 | (uint)(bVar3 & 0x7f) << (bVar6 & 0x1f);
    bVar6 = bVar6 + 7;
  } while ((char)bVar3 < '\0');
  ldata->lattr = (unsigned_short)uVar7;
  ldata->trusted = (_Bool)((byte)(uVar7 >> 0x10) & 1);
  readrle(&local_58,ldata,readliteral_chr);
  readrle(&local_58,ldata,readliteral_attr);
  readrle(&local_58,ldata,readliteral_truecolour);
  readrle(&local_58,ldata,readliteral_cc);
  if ((local_58.binarysource_)->err != BSE_NO_ERROR) {
    __assert_fail("!get_err(bs)",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                  ,0x3d9,"termline *decompressline(compressed_scrollback_line *)");
  }
  if ((local_58.binarysource_)->len != (local_58.binarysource_)->pos) {
    __assert_fail("get_avail(bs) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                  ,0x3da,"termline *decompressline(compressed_scrollback_line *)");
  }
  return ldata;
}

Assistant:

static termline *decompressline(compressed_scrollback_line *line)
{
    int ncols, byte, shift;
    BinarySource bs[1];
    termline *ldata;

    BinarySource_BARE_INIT(bs, line+1, line->len);

    /*
     * First read in the column count.
     */
    ncols = shift = 0;
    do {
        byte = get_byte(bs);
        ncols |= (byte & 0x7F) << shift;
        shift += 7;
    } while (byte & 0x80);

    /*
     * Now create the output termline.
     */
    ldata = snew(termline);
    ldata->chars = snewn(ncols, termchar);
    ldata->cols = ldata->size = ncols;
    ldata->temporary = true;
    ldata->cc_free = 0;

    /*
     * We must set all the cc pointers in ldata->chars to 0 right
     * now, so that cc diagnostics that verify the integrity of the
     * whole line will make sense while we're in the middle of
     * building it up.
     */
    {
        int i;
        for (i = 0; i < ldata->cols; i++)
            ldata->chars[i].cc_next = 0;
    }

    /*
     * Now read in the lattr.
     */
    int lattr = shift = 0;
    do {
        byte = get_byte(bs);
        lattr |= (byte & 0x7F) << shift;
        shift += 7;
    } while (byte & 0x80);
    ldata->lattr = lattr & 0xFFFF;
    ldata->trusted = (lattr & 0x10000) != 0;

    /*
     * Now we read in each of the RLE streams in turn.
     */
    readrle(bs, ldata, readliteral_chr);
    readrle(bs, ldata, readliteral_attr);
    readrle(bs, ldata, readliteral_truecolour);
    readrle(bs, ldata, readliteral_cc);

    /* And we always expect that we ended up exactly at the end of the
     * compressed data. */
    assert(!get_err(bs));
    assert(get_avail(bs) == 0);

    return ldata;
}